

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O1

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
kratos::VerilogModule::verilog_src_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,VerilogModule *this)

{
  SystemVerilogCodeGenOptions *in_RCX;
  undefined1 local_78 [25];
  undefined7 uStack_5f;
  _Alloc_hider local_50;
  char *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  undefined1 local_28;
  
  local_78._0_2_ = 1;
  local_78._16_8_ = (pointer)0x0;
  local_78[0x18] = 0;
  local_50._M_p = (pointer)0x50;
  local_40._M_allocated_capacity = 0;
  local_40._M_local_buf[8] = '\0';
  local_28 = 0;
  local_78._8_8_ = (pointer)(local_78 + 0x18);
  local_48 = local_40._M_local_buf + 8;
  generate_verilog_abi_cxx11_(__return_storage_ptr__,*(kratos **)this,(Generator *)local_78,in_RCX);
  if (local_48 != local_40._M_local_buf + 8) {
    operator_delete(local_48,CONCAT71(local_40._9_7_,local_40._M_local_buf[8]) + 1);
  }
  if ((pointer)local_78._8_8_ != (pointer)(local_78 + 0x18)) {
    operator_delete((void *)local_78._8_8_,CONCAT71(uStack_5f,local_78[0x18]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, std::string> VerilogModule::verilog_src() {
    return generate_verilog(generator_, {});
}